

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LAJIVM.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  string *this;
  allocator local_d1;
  string r_str;
  string str;
  string temp;
  string local_70;
  string local_50;
  string local_30;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  r_str._M_dataplus._M_p = (pointer)&r_str.field_2;
  r_str._M_string_length = 0;
  r_str.field_2._M_local_buf[0] = '\0';
  init_all();
  if (argc == 3) {
    std::__cxx11::string::string((string *)&temp,argv[1],&local_d1);
    bVar1 = std::operator==(&temp,"d");
    if (bVar1) {
      is_debug = true;
      std::__cxx11::string::assign((char *)&r_str);
      std::__cxx11::string::string((string *)&local_50,(string *)&r_str);
      iVar2 = doit(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      puts(&DAT_00107121);
      iVar2 = 1;
    }
    this = &temp;
  }
  else if (argc == 2) {
    std::__cxx11::string::assign((char *)&r_str);
    std::__cxx11::string::string((string *)&local_30,(string *)&r_str);
    iVar2 = doit(&local_30);
    this = &local_30;
  }
  else {
    puts(&DAT_001070d4);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&str);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      exit(0);
    }
    if (*str._M_dataplus._M_p == 'd') {
      lVar4 = std::__cxx11::string::find((char)&str,0x20);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&r_str);
      }
      else {
        std::__cxx11::string::substr((ulong)&temp,(ulong)&str);
        std::__cxx11::string::operator=((string *)&r_str,(string *)&temp);
        std::__cxx11::string::~string((string *)&temp);
        is_debug = true;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&r_str);
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&r_str);
    iVar2 = doit(&local_70);
    this = &local_70;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&r_str);
  std::__cxx11::string::~string((string *)&str);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
	std::string str;
	std::string r_str;
	try { init_all(); }
	catch (int e) {
		printf("初始化失败 %08X\n",e);
		return -1;
	}
	if (argc == 2) {
		r_str = argv[1];
        return  doit(r_str);
	}else if(argc == 3)
	{
		std::string temp = argv[1];
		if (temp == "d") {
			is_debug = true;
			r_str = argv[2];
            return doit(r_str);
		}else{
			printf("命令行参数错误\n");
            return 1;
		}
	}

	printf("虚拟机初始化完成请输入二进制文件路径,输入ctrl+z退出：\n");
	if (!std::getline(std::cin,str)) exit(0);
	if (*str.begin() == 'd') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			r_str = str.substr(temp + 1);
			is_debug = true;
		}
		else r_str = str;
	}
	else r_str = str;
    return doit(r_str);
}